

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_Ticker(void)

{
  FConsoleBuffer *this;
  int iVar1;
  uint newsize;
  int iVar2;
  
  if (C_Ticker::lasttic == 0) {
    C_Ticker::lasttic = consoletic;
  }
  consoletic = consoletic + 1;
  iVar1 = FIntCVar::operator_cast_to_int(&con_buffersize);
  this = conbuffer;
  if (0 < iVar1) {
    newsize = FIntCVar::operator_cast_to_int(&con_buffersize);
    FConsoleBuffer::ResizeBuffer(this,newsize);
  }
  if (ConsoleState != c_up) {
    if (ConsoleState == c_falling) {
      iVar1 = consoletic - C_Ticker::lasttic;
      iVar2 = DCanvas::GetHeight((DCanvas *)screen);
      iVar1 = iVar1 * ((iVar2 << 1) / 0x19) + ConBottom;
      ConBottom = iVar1;
      iVar2 = DCanvas::GetHeight((DCanvas *)screen);
      if (iVar2 / 2 <= iVar1) {
        iVar1 = DCanvas::GetHeight((DCanvas *)screen);
        ConBottom = iVar1 / 2;
        ConsoleState = c_down;
      }
    }
    else if (ConsoleState == c_rising) {
      iVar1 = consoletic - C_Ticker::lasttic;
      iVar2 = DCanvas::GetHeight((DCanvas *)screen);
      ConBottom = ConBottom - iVar1 * ((iVar2 << 1) / 0x19);
      if (ConBottom < 1) {
        ConsoleState = c_up;
        ConBottom = 0;
      }
    }
  }
  CursorTicker = CursorTicker + -1;
  if (CursorTicker < 1) {
    cursoron = (cursoron & 1U) != 1;
    CursorTicker = 0x11;
  }
  C_Ticker::lasttic = consoletic;
  FNotifyBuffer::Tick(&NotifyStrings);
  return;
}

Assistant:

void C_Ticker()
{
	static int lasttic = 0;
	consoletic++;

	if (lasttic == 0)
		lasttic = consoletic - 1;

	if (con_buffersize > 0)
	{
		conbuffer->ResizeBuffer(con_buffersize);
	}

	if (ConsoleState != c_up)
	{
		if (ConsoleState == c_falling)
		{
			ConBottom += (consoletic - lasttic) * (SCREENHEIGHT * 2 / 25);
			if (ConBottom >= SCREENHEIGHT / 2)
			{
				ConBottom = SCREENHEIGHT / 2;
				ConsoleState = c_down;
			}
		}
		else if (ConsoleState == c_rising)
		{
			ConBottom -= (consoletic - lasttic) * (SCREENHEIGHT * 2 / 25);
			if (ConBottom <= 0)
			{
				ConsoleState = c_up;
				ConBottom = 0;
			}
		}
	}

	if (--CursorTicker <= 0)
	{
		cursoron ^= 1;
		CursorTicker = C_BLINKRATE;
	}

	lasttic = consoletic;
	NotifyStrings.Tick();
}